

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valence_cache.h
# Opt level: O0

void __thiscall
draco::ValenceCache<draco::CornerTable>::ClearValenceCache(ValenceCache<draco::CornerTable> *this)

{
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
  *in_stack_ffffffffffffffb8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> *this_00;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> local_20;
  
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::clear
            ((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> *)
             0x1b56ac);
  this_00 = &local_20;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
  IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                   *)0x1b56bb);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::swap
            (this_00,in_stack_ffffffffffffffb8);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
  ~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                    *)0x1b56d6);
  return;
}

Assistant:

void ClearValenceCache() const {
    vertex_valence_cache_32_bit_.clear();
    // Force erasure.
    IndexTypeVector<VertexIndex, int32_t>().swap(vertex_valence_cache_32_bit_);
  }